

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

void __thiscall ot::commissioner::DtlsSession::Reconnect(DtlsSession *this)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  if (this->mIsServer != false) {
    Reset(this);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              ((function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> *)
               &local_30,&this->mOnConnected);
    Connect(this,(ConnectHandler *)&local_30);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp"
                ,0x130,"void ot::commissioner::DtlsSession::Reconnect()");
}

Assistant:

void DtlsSession::Reconnect()
{
    ASSERT(mIsServer);
    Reset();
    Connect(mOnConnected);
}